

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerHLSL::is_hlsl_resource_binding_used
          (CompilerHLSL *this,ExecutionModel model,uint32_t desc_set,uint32_t binding)

{
  bool bVar1;
  pointer pvVar2;
  byte local_39;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
  local_30;
  const_iterator itr;
  StageSetBinding tuple;
  uint32_t binding_local;
  uint32_t desc_set_local;
  ExecutionModel model_local;
  CompilerHLSL *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
  ._M_cur._0_4_ = model;
  itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
  ._M_cur._4_4_ = desc_set;
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>_>_>
       ::find(&this->resource_bindings,(key_type *)&itr);
  local_38._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<spirv_cross::StageSetBinding,std::pair<spirv_cross::HLSLResourceBinding,bool>,spirv_cross::InternalHasher,std::equal_to<spirv_cross::StageSetBinding>,std::allocator<std::pair<spirv_cross::StageSetBinding_const,std::pair<spirv_cross::HLSLResourceBinding,bool>>>>>
                 (&this->resource_bindings);
  bVar1 = ::std::__detail::operator!=(&local_30,&local_38);
  local_39 = 0;
  if (bVar1) {
    pvVar2 = ::std::__detail::
             _Node_const_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_false,_true>
                           *)&local_30);
    local_39 = (pvVar2->second).second;
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool CompilerHLSL::is_hlsl_resource_binding_used(ExecutionModel model, uint32_t desc_set, uint32_t binding) const
{
	StageSetBinding tuple = { model, desc_set, binding };
	auto itr = resource_bindings.find(tuple);
	return itr != end(resource_bindings) && itr->second.second;
}